

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamReaderPrivate::BamReaderPrivate(BamReaderPrivate *this,BamReader *parent)

{
  this->m_alignmentsBeginOffset = 0;
  (this->m_filename)._M_dataplus._M_p = (pointer)&(this->m_filename).field_2;
  (this->m_filename)._M_string_length = 0;
  (this->m_filename).field_2._M_local_buf[0] = '\0';
  (this->m_references).super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_references).super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_references).super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_parent = parent;
  BamHeader::BamHeader(&this->m_header);
  BamRandomAccessController::BamRandomAccessController(&this->m_randomAccessController);
  BgzfStream::BgzfStream(&this->m_stream);
  (this->m_errorString)._M_dataplus._M_p = (pointer)&(this->m_errorString).field_2;
  (this->m_errorString)._M_string_length = 0;
  (this->m_errorString).field_2._M_local_buf[0] = '\0';
  this->m_isBigEndian = false;
  return;
}

Assistant:

BamReaderPrivate::BamReaderPrivate(BamReader* parent)
    : m_alignmentsBeginOffset(0)
    , m_parent(parent)
{
    m_isBigEndian = BamTools::SystemIsBigEndian();
}